

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O1

void anon_unknown.dwarf_b4179::ColorSwatchTextRegBits<>
               (Emulator *e,u8 v,PaletteRGBA pal_rgba,int color_index)

{
  ImU32 col;
  ImDrawList *this;
  undefined7 in_register_00000031;
  float fVar1;
  ImVec2 p;
  ImVec2 local_38;
  undefined8 local_30;
  undefined8 local_28;
  ImVec2 local_20;
  
  local_30 = CONCAT71(in_register_00000031,v);
  local_28 = pal_rgba.color._0_8_;
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%d:",(ulong)pal_rgba.color[2]);
  col = *(ImU32 *)((long)&local_30 +
                  (ulong)((uint)e >> ((char)pal_rgba.color[2] * '\x02' & 0x1fU) & 3) * 4);
  fVar1 = ImGui::GetTextLineHeight();
  ImGui::SameLine(0.0,-1.0);
  local_20 = ImGui::GetCursorScreenPos();
  this = ImGui::GetWindowDrawList();
  local_38.x = local_20.x + fVar1;
  local_38.y = local_20.y + fVar1;
  ImDrawList::AddRectFilled(this,&local_20,&local_38,col,0.0,0);
  local_38.x = fVar1;
  local_38.y = fVar1;
  ImGui::Dummy(&local_38);
  return;
}

Assistant:

void ColorSwatchTextRegBits(Emulator* e, u8 v, PaletteRGBA pal_rgba,
                            int color_index, Args... args) {
  ImGui::SameLine();
  ImGui::Text("%d:", color_index);
  u8 color = (v >> (color_index * 2)) & 3;
  RGBA color_rgba = pal_rgba.color[color];
  float sz = ImGui::GetTextLineHeight();
  ImGui::SameLine();
  ImVec2 p = ImGui::GetCursorScreenPos();
  ImGui::GetWindowDrawList()->AddRectFilled(p, ImVec2(p.x + sz, p.y + sz),
                                            color_rgba);
  ImGui::Dummy(ImVec2(sz, sz));
  TextRegBits(e, v, args...);
}